

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O0

void __thiscall cmCTestCVS::cmCTestCVS(cmCTestCVS *this,cmCTest *ct,ostream *log)

{
  ostream *log_local;
  cmCTest *ct_local;
  cmCTestCVS *this_local;
  
  cmCTestVC::cmCTestVC(&this->super_cmCTestVC,ct,log);
  (this->super_cmCTestVC)._vptr_cmCTestVC = (_func_int **)&PTR__cmCTestCVS_00c16530;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCVS::Directory,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCVS::Directory>_>_>
  ::map(&this->Dirs);
  return;
}

Assistant:

cmCTestCVS::cmCTestCVS(cmCTest* ct, std::ostream& log): cmCTestVC(ct, log)
{
}